

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

void av1_tile_set_col(TileInfo *tile,AV1_COMMON *cm,int col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = (byte)cm->seq_params->mib_size_log2;
  iVar2 = (cm->tiles).col_start_sb[col];
  iVar3 = (cm->tiles).col_start_sb[(long)col + 1] << (bVar1 & 0x1f);
  tile->tile_col = col;
  tile->mi_col_start = iVar2 << (bVar1 & 0x1f);
  iVar2 = (cm->mi_params).mi_cols;
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  tile->mi_col_end = iVar3;
  return;
}

Assistant:

void av1_tile_set_col(TileInfo *tile, const AV1_COMMON *cm, int col) {
  assert(col < cm->tiles.cols);
  int mi_col_start = cm->tiles.col_start_sb[col]
                     << cm->seq_params->mib_size_log2;
  int mi_col_end = cm->tiles.col_start_sb[col + 1]
                   << cm->seq_params->mib_size_log2;
  tile->tile_col = col;
  tile->mi_col_start = mi_col_start;
  tile->mi_col_end = AOMMIN(mi_col_end, cm->mi_params.mi_cols);
  assert(tile->mi_col_end > tile->mi_col_start);
}